

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.h
# Opt level: O2

cmplx __thiscall klogic::mvn::output(mvn *this,cvector *X)

{
  int k;
  cmplx cVar1;
  cmplx local_18;
  
  k = this->k;
  weighted_sum(this,(X->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
               (X->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish);
  cVar1 = activation(k,&local_18);
  return (cmplx)cVar1._M_value;
}

Assistant:

cmplx output(const cvector &X) const {
            return activation(k, weighted_sum(X.begin(), X.end()));
        }